

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

int enum_min(MetaContainer meta)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  MetaIterator *pMVar5;
  char *pcVar6;
  MetaIterator a;
  MetaIterator m_1;
  MetaIterator __end1_1;
  MetaIterator __begin1_1;
  MetaContainer *__range1_1;
  MetaIterator m;
  MetaIterator __end1;
  MetaIterator __begin1;
  MetaContainer *__range1;
  int min;
  int local_a8;
  MetaContainer *in_stack_ffffffffffffff60;
  MetaIterator *in_stack_ffffffffffffff68;
  MetaIterator local_70;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  MetaIterator local_38;
  MetaIterator local_28;
  undefined1 *local_18;
  int local_c;
  undefined1 local_8 [8];
  
  local_c = 0;
  local_18 = local_8;
  local_28 = rtosc::Port::MetaContainer::begin(in_stack_ffffffffffffff60);
  local_38 = rtosc::Port::MetaContainer::end((MetaContainer *)0x10bde4);
  while( true ) {
    local_48 = local_38.title;
    local_40 = local_38.value;
    bVar2 = rtosc::Port::MetaIterator::operator!=(&local_28,local_38);
    if (!bVar2) break;
    pMVar5 = rtosc::Port::MetaIterator::operator*(&local_28);
    local_58 = pMVar5->title;
    local_50 = pMVar5->value;
    pcVar4 = strstr(local_58,"map ");
    if (pcVar4 != (char *)0x0) {
      local_c = atoi(local_58 + 4);
    }
    rtosc::Port::MetaIterator::operator++(in_stack_ffffffffffffff68);
  }
  local_60 = local_8;
  local_70 = rtosc::Port::MetaContainer::begin(in_stack_ffffffffffffff60);
  a = rtosc::Port::MetaContainer::end((MetaContainer *)0x10bea8);
  while( true ) {
    bVar2 = rtosc::Port::MetaIterator::operator!=(&local_70,a);
    if (!bVar2) break;
    pMVar5 = rtosc::Port::MetaIterator::operator*(&local_70);
    pcVar4 = pMVar5->title;
    pMVar5 = (MetaIterator *)pMVar5->value;
    pcVar6 = strstr(pcVar4,"map ");
    iVar1 = local_c;
    if (pcVar6 != (char *)0x0) {
      iVar3 = atoi(pcVar4 + 4);
      if (iVar3 < iVar1) {
        local_a8 = atoi(pcVar4 + 4);
      }
      else {
        local_a8 = local_c;
      }
      local_c = local_a8;
    }
    rtosc::Port::MetaIterator::operator++(pMVar5);
  }
  return local_c;
}

Assistant:

static int enum_min(Port::MetaContainer meta)
{
    int min = 0;
    for(auto m:meta)
        if(strstr(m.title, "map "))
            min = atoi(m.title+4);

    for(auto m:meta)
        if(strstr(m.title, "map "))
            min = min>atoi(m.title+4) ? atoi(m.title+4) : min;

    return min;
}